

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce_load_size.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(ReduceLoadSize *this,Instruction *inst)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  ulong uVar2;
  ConstantManager *this_01;
  TypeManager *this_02;
  bool bVar3;
  uint32_t uVar4;
  uint32_t id;
  int iVar5;
  uint uVar6;
  Instruction *this_03;
  _Hash_node_base *p_Var7;
  Type *pTVar8;
  undefined4 extraout_var;
  Constant *this_04;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *pmVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  ulong uVar13;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_used;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_58;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar4 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar4 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar4);
  this_03 = analysis::DefUseManager::GetDef(this_00,uVar4);
  uVar13 = 0;
  if (this_03->opcode_ == OpLoad) {
    if (this_03->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
      uVar13 = (ulong)uVar4;
    }
    uVar2 = (this->should_replace_cache_)._M_h._M_bucket_count;
    uVar10 = uVar13 % uVar2;
    p_Var11 = (this->should_replace_cache_)._M_h._M_buckets[uVar10];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var11->_M_nxt, p_Var12 = p_Var11,
       (uint)uVar13 != *(uint *)&p_Var11->_M_nxt[1]._M_nxt)) {
      while (p_Var11 = p_Var7, p_Var7 = p_Var11->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var7[1]._M_nxt % uVar2 != uVar10) ||
           (p_Var12 = p_Var11, (uint)uVar13 == *(uint *)&p_Var7[1]._M_nxt)) goto LAB_004f3928;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_004f3928:
    if (p_Var12 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var12->_M_nxt;
    }
    if (p_Var7 == (_Hash_node_base *)0x0) {
      local_58._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_58._M_impl.super__Rb_tree_header._M_header;
      local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = &local_58;
      pcStack_60 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:137:44)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp:137:44)>
                 ::_M_manager;
      local_58._M_impl.super__Rb_tree_header._M_header._M_right =
           local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar3 = analysis::DefUseManager::WhileEachUser
                        (this_00,this_03,(function<bool_(spvtools::opt::Instruction_*)> *)&local_78)
      ;
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      uVar4 = 0;
      uVar13 = 0;
      if ((bVar3) && (uVar13 = 1, this->replacement_threshold_ < 1.0)) {
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
          IRContext::BuildConstantManager(pIVar1);
        }
        this_01 = (pIVar1->constant_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                  _M_head_impl;
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
          IRContext::BuildTypeManager(pIVar1);
        }
        this_02 = (pIVar1->type_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl
        ;
        id = 0;
        if (this_03->has_type_id_ == true) {
          id = Instruction::GetSingleWordOperand(this_03,0);
        }
        pTVar8 = analysis::TypeManager::GetType(this_02,id);
        if (pTVar8->kind_ == kStruct) {
          iVar5 = (*pTVar8->_vptr_Type[0x1d])();
          uVar6 = (uint)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar5) + 0x30) -
                                *(long *)(CONCAT44(extraout_var_01,iVar5) + 0x28)) >> 3);
        }
        else {
          uVar6 = 1;
          if (pTVar8->kind_ == kArray) {
            iVar5 = (*pTVar8->_vptr_Type[0x17])();
            this_04 = analysis::ConstantManager::FindDeclaredConstant
                                (this_01,*(uint32_t *)(CONCAT44(extraout_var,iVar5) + 0x30));
            if (this_04 == (Constant *)0x0) {
              uVar6 = 0xffffffff;
            }
            else {
              iVar5 = (*this_04->_vptr_Constant[0xe])(this_04);
              if (CONCAT44(extraout_var_00,iVar5) == 0) {
                __assert_fail("size_const->AsIntConstant()",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/reduce_load_size.cpp"
                              ,0xa3,
                              "bool spvtools::opt::ReduceLoadSize::ShouldReplaceExtract(Instruction *)"
                             );
              }
              uVar6 = analysis::Constant::GetU32(this_04);
            }
          }
        }
        uVar13 = (ulong)((((double)CONCAT44(0x45300000,
                                            (int)(local_58._M_impl.super__Rb_tree_header.
                                                  _M_node_count >> 0x20)) - 1.9342813113834067e+25)
                         + ((double)CONCAT44(0x43300000,
                                             (int)local_58._M_impl.super__Rb_tree_header.
                                                  _M_node_count) - 4503599627370496.0)) /
                         (double)uVar6 < this->replacement_threshold_);
      }
      if (this_03->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(this_03,(uint)this_03->has_type_id_);
      }
      local_78._0_4_ = uVar4;
      pmVar9 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->should_replace_cache_,(key_type *)local_78._M_pod_data);
      *pmVar9 = SUB81(uVar13,0);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase(&local_58,(_Link_type)local_58._M_impl.super__Rb_tree_header._M_header._M_parent);
    }
    else {
      uVar13 = (ulong)*(byte *)((long)&p_Var7[1]._M_nxt + 4);
    }
  }
  return SUB81(uVar13,0);
}

Assistant:

bool ReduceLoadSize::ShouldReplaceExtract(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  Instruction* op_inst = def_use_mgr->GetDef(
      inst->GetSingleWordInOperand(kExtractCompositeIdInIdx));

  if (op_inst->opcode() != spv::Op::OpLoad) {
    return false;
  }

  auto cached_result = should_replace_cache_.find(op_inst->result_id());
  if (cached_result != should_replace_cache_.end()) {
    return cached_result->second;
  }

  bool all_elements_used = false;
  std::set<uint32_t> elements_used;

  all_elements_used =
      !def_use_mgr->WhileEachUser(op_inst, [&elements_used](Instruction* use) {
        if (use->IsCommonDebugInstr()) return true;
        if (use->opcode() != spv::Op::OpCompositeExtract ||
            use->NumInOperands() == 1) {
          return false;
        }
        elements_used.insert(use->GetSingleWordInOperand(1));
        return true;
      });

  bool should_replace = false;
  if (all_elements_used) {
    should_replace = false;
  } else if (1.0 <= replacement_threshold_) {
    should_replace = true;
  } else {
    analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Type* load_type = type_mgr->GetType(op_inst->type_id());
    uint32_t total_size = 1;
    switch (load_type->kind()) {
      case analysis::Type::kArray: {
        const analysis::Constant* size_const =
            const_mgr->FindDeclaredConstant(load_type->AsArray()->LengthId());

        if (size_const) {
          assert(size_const->AsIntConstant());
          total_size = size_const->GetU32();
        } else {
          // The size is spec constant, so it is unknown at this time.  Assume
          // it is very large.
          total_size = UINT32_MAX;
        }
      } break;
      case analysis::Type::kStruct:
        total_size = static_cast<uint32_t>(
            load_type->AsStruct()->element_types().size());
        break;
      default:
        break;
    }
    double percent_used = static_cast<double>(elements_used.size()) /
                          static_cast<double>(total_size);
    should_replace = (percent_used < replacement_threshold_);
  }

  should_replace_cache_[op_inst->result_id()] = should_replace;
  return should_replace;
}